

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int auxgetstr(lua_State *L,TValue *t,char *k)

{
  StkId pSVar1;
  TString *key;
  TString *x_;
  TValue *io;
  TString *str;
  lu_byte tag;
  char *k_local;
  TValue *t_local;
  lua_State *L_local;
  
  key = luaS_new(L,k);
  if (t->tt_ == 'E') {
    str._7_1_ = luaH_getstr((Table *)(t->value_).gc,key,&((L->top).p)->val);
  }
  else {
    str._7_1_ = 0x30;
  }
  if ((str._7_1_ & 0xf) == 0) {
    pSVar1 = (L->top).p;
    *(TString **)pSVar1 = key;
    (pSVar1->val).tt_ = key->tt | 0x40;
    (L->top).p = (StkId)((L->top).offset + 0x10);
    str._7_1_ = luaV_finishget(L,t,(TValue *)((L->top).offset + -0x10),
                               (StkId)((L->top).offset + -0x10),str._7_1_);
  }
  else {
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  return str._7_1_ & 0xf;
}

Assistant:

static int auxgetstr (lua_State *L, const TValue *t, const char *k) {
  lu_byte tag;
  TString *str = luaS_new(L, k);
  luaV_fastget(t, str, s2v(L->top.p), luaH_getstr, tag);
  if (!tagisempty(tag))
    api_incr_top(L);
  else {
    setsvalue2s(L, L->top.p, str);
    api_incr_top(L);
    tag = luaV_finishget(L, t, s2v(L->top.p - 1), L->top.p - 1, tag);
  }
  lua_unlock(L);
  return novariant(tag);
}